

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_cont_4d(ggml_context *ctx,ggml_tensor *a,int64_t ne0,int64_t ne1,int64_t ne2,int64_t ne3)

{
  ggml_tensor *tensor;
  int64_t local_38;
  int64_t local_30;
  int64_t local_28;
  int64_t local_20;
  
  if (a->ne[1] * a->ne[0] * a->ne[2] * a->ne[3] - ne2 * ne3 * ne1 * ne0 == 0) {
    local_38 = ne0;
    local_30 = ne1;
    local_28 = ne2;
    local_20 = ne3;
    tensor = ggml_new_tensor_impl(ctx,a->type,4,&local_38,(ggml_tensor *)0x0,0);
    ggml_format_name(tensor,"%s (cont)",a->name);
    tensor->op = GGML_OP_CONT;
    tensor->src[0] = a;
    return tensor;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xbe6,
             "GGML_ASSERT(%s) failed","ggml_nelements(a) == (ne0*ne1*ne2*ne3)");
}

Assistant:

struct ggml_tensor * ggml_cont_4d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int64_t               ne0,
        int64_t               ne1,
        int64_t               ne2,
        int64_t               ne3) {
    GGML_ASSERT(ggml_nelements(a) == (ne0*ne1*ne2*ne3));

    struct ggml_tensor * result = ggml_new_tensor_4d(ctx, a->type, ne0, ne1, ne2, ne3);
    ggml_format_name(result, "%s (cont)", a->name);

    result->op     = GGML_OP_CONT;
    result->src[0] = a;

    return result;
}